

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::FakeLoaderCallback::load
          (FakeLoaderCallback *this,SchemaLoader *loader,uint64_t id)

{
  uint64_t uVar1;
  bool local_31;
  uint64_t uStack_30;
  bool _kj_shouldLog_1;
  bool local_21;
  uint64_t uStack_20;
  bool _kj_shouldLog;
  uint64_t id_local;
  SchemaLoader *loader_local;
  FakeLoaderCallback *this_local;
  
  if (id != 0x4d2) {
    uStack_20 = id;
    id_local = (uint64_t)loader;
    loader_local = (SchemaLoader *)this;
    uVar1 = capnp::schema::Node::Reader::getId(&this->node);
    if (uVar1 != uStack_20) {
      local_21 = kj::_::Debug::shouldLog(ERROR);
      while (local_21 != false) {
        uStack_30 = capnp::schema::Node::Reader::getId(&this->node);
        kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0x11e,ERROR,"\"failed: expected \" \"(node.getId()) == (id)\", node.getId(), id"
                   ,(char (*) [40])"failed: expected (node.getId()) == (id)",
                   &stack0xffffffffffffffd0,&stack0xffffffffffffffe0);
        local_21 = false;
      }
    }
    if ((this->loaded & 1U) != 0) {
      local_31 = kj::_::Debug::shouldLog(ERROR);
      while (local_31 != false) {
        kj::_::Debug::log<char_const(&)[27]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0x11f,ERROR,"\"failed: expected \" \"!(loaded)\"",
                   (char (*) [27])"failed: expected !(loaded)");
        local_31 = false;
      }
    }
    this->loaded = true;
    SchemaLoader::loadOnce((SchemaLoader *)id_local,&this->node);
  }
  return;
}

Assistant:

void load(const SchemaLoader& loader, uint64_t id) const override {
    if (id == 1234) {
      // Magic "not found" ID.
      return;
    }

    EXPECT_EQ(node.getId(), id);
    EXPECT_FALSE(loaded);
    loaded = true;
    loader.loadOnce(node);
  }